

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O1

LY_ERR schema_mount_validate
                 (lysc_ext_instance *ext,lyd_node *sibling,lyd_node *dep_tree,lyd_type data_type,
                 uint32_t val_opts,lyd_node **diff)

{
  lysc_node *plVar1;
  LY_ERR err;
  LY_ERR LVar2;
  lyd_node *plVar3;
  char *xpath;
  lyd_node *plVar4;
  ly_err_item *eitem;
  lys_module *plVar5;
  lyd_node **pplVar6;
  lyd_node_inner *target;
  lyd_node_inner *plVar7;
  ulong uVar8;
  ly_bool ext_data_free;
  ly_set *ref_set;
  lyd_node *diff_parent;
  lyd_node *ext_diff;
  ly_set *par_set;
  lyd_node *ext_data;
  ly_set *set;
  uint32_t temp_lo;
  lyd_node *top_node;
  undefined8 in_stack_ffffffffffffff48;
  ly_bool local_a9;
  lyd_node **local_a8;
  lyd_node *local_a0;
  ly_set *local_98;
  lyd_node_inner *local_90;
  lyd_node_inner *local_88;
  lyd_node *local_80;
  ly_set *local_78;
  lyd_node *local_70;
  lyd_node *local_68;
  ly_set *local_60;
  ly_ctx *local_58;
  uint32_t local_4c;
  lyd_node_inner *local_48;
  lyd_node *local_40;
  ulong local_38;
  
  local_4c = 6;
  local_70 = (lyd_node *)0x0;
  if (sibling == (lyd_node *)0x0) {
    local_48 = (lyd_node_inner *)0x0;
  }
  else {
    local_48 = sibling->parent;
  }
  local_80 = (lyd_node *)0x0;
  local_88 = (lyd_node_inner *)0x0;
  local_a9 = '\0';
  local_98 = (ly_set *)0x0;
  local_a0 = sibling;
  if (sibling == (lyd_node *)0x0) {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/schema_mount.c"
               ,CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0x393));
    return LY_EINT;
  }
  err = lyplg_ext_get_data(ext->module->ctx,ext,&local_70,&local_a9);
  plVar4 = local_70;
  if (err == LY_SUCCESS) {
    for (; plVar4 != (lyd_node *)0x0; plVar4 = plVar4->next) {
      if ((plVar4->flags & 4) != 0) {
        lyplg_ext_compile_log
                  ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,
                   "Provided ext data have not been validated.");
        err = LY_EINVAL;
        goto LAB_001a3a5e;
      }
    }
    if (local_a0->schema == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&local_a0[2].schema;
    }
    else {
      plVar5 = local_a0->schema->module;
    }
    local_58 = plVar5->ctx;
    local_60 = (ly_set *)0x0;
    local_78 = (ly_set *)0x0;
    local_90 = (lyd_node_inner *)0x0;
    local_98 = (ly_set *)0x0;
    if (local_70 == (lyd_node *)0x0) {
      err = LY_EINVAL;
      lyplg_ext_compile_log((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,"No ext data provided.");
    }
    else {
      err = schema_mount_get_parent_ref(ext,local_70,&local_60);
      if ((err == LY_SUCCESS) && (err = ly_set_new(&local_98), err == LY_SUCCESS)) {
        local_68 = (lyd_node *)0x0;
        if (local_60->count == 0) {
          err = LY_SUCCESS;
        }
        else {
          uVar8 = 0;
          local_a8 = diff;
          while( true ) {
            plVar7 = (local_60->field_2).dnodes[uVar8][1].parent;
            local_38 = uVar8;
            xpath = lyxp_get_expr(*(lyxp_expr **)&plVar7->field_0);
            err = lyd_find_xpath3((lyd_node *)local_48,(lyd_node *)local_48,xpath,
                                  *(LY_VALUE_FORMAT *)((long)&plVar7->field_0 + 0x18),
                                  (plVar7->field_0).node.parent,(lyxp_var *)0x0,&local_78);
            if (err != LY_SUCCESS) break;
            if (local_78->count != 0) {
              uVar8 = 0;
              do {
                err = lyd_dup_single_to_ctx
                                ((local_78->field_2).dnodes[uVar8],local_58,(lyd_node_inner *)0x0,
                                 0x1d,(lyd_node **)&local_90);
                diff = local_a8;
                if (err != LY_SUCCESS) goto LAB_001a3b99;
                plVar7 = (local_90->field_0).node.parent;
                target = local_90;
                while (plVar7 != (lyd_node_inner *)0x0) {
                  target = plVar7;
                  if (local_90 == (lyd_node_inner *)0x0) {
                    target = local_90;
                  }
                  plVar7 = *(lyd_node_inner **)((long)&target->field_0 + 0x10);
                }
                local_90 = target;
                if (local_68 == (lyd_node *)0x0) {
                  local_40 = (lyd_node *)0x0;
                }
                else {
                  err = lyd_find_sibling_first(local_68,(lyd_node *)target,&local_40);
                  if ((err != LY_SUCCESS) && (diff = local_a8, err != LY_ENOTFOUND))
                  goto LAB_001a3b99;
                }
                if (local_40 == (lyd_node *)0x0) {
                  err = lyd_insert_sibling(local_68,(lyd_node *)local_90,&local_68);
                  diff = local_a8;
                  if (err != LY_SUCCESS) goto LAB_001a3b99;
                  err = ly_set_add(local_98,local_90,'\x01',(uint32_t *)0x0);
                  diff = local_a8;
                }
                else {
                  err = lyd_merge_tree(&local_68,(lyd_node *)local_90,1);
                  local_90 = (lyd_node_inner *)0x0;
                  diff = local_a8;
                }
                local_a8 = diff;
                if (err != LY_SUCCESS) goto LAB_001a3b99;
                local_90 = (lyd_node_inner *)0x0;
                uVar8 = uVar8 + 1;
              } while (uVar8 < local_78->count);
            }
            uVar8 = local_38 + 1;
            err = LY_SUCCESS;
            diff = local_a8;
            if (local_60->count <= uVar8) goto LAB_001a3b99;
          }
          lyxp_get_expr(*(lyxp_expr **)&plVar7->field_0);
          lyplg_ext_compile_log
                    ((lysc_ctx *)0x0,ext,LY_LLERR,err,"Parent reference \"%s\" evaluation failed.");
          diff = local_a8;
        }
      }
    }
LAB_001a3b99:
    ly_set_free(local_60,(_func_void_void_ptr *)0x0);
    ly_set_free(local_78,(_func_void_void_ptr *)0x0);
    lyd_free_tree((lyd_node *)local_90);
    if (err != LY_SUCCESS) {
      if (local_98 != (ly_set *)0x0) {
        if (local_98->count != 0) {
          lyd_free_siblings(*(local_98->field_2).dnodes);
        }
        ly_set_free(local_98,(_func_void_void_ptr *)0x0);
        local_98 = (ly_set *)0x0;
      }
      if (err != LY_SUCCESS) goto LAB_001a3a5e;
    }
    plVar4 = local_a0;
    local_a8 = diff;
    LVar2 = lyd_unlink_siblings((lyd_node *)0x1a3c0a);
    plVar3 = local_a0;
    err = LY_SUCCESS;
    if (LVar2 == LY_SUCCESS) {
      for (; plVar3 != (lyd_node *)0x0; plVar3 = plVar3->next) {
        *(byte *)&plVar3->flags = (byte)plVar3->flags & 0xf7;
      }
      if ((local_98->count == 0) ||
         (err = lyd_insert_sibling(local_a0,*(local_98->field_2).dnodes,&local_a0),
         err == LY_SUCCESS)) {
        local_58 = (ly_ctx *)ly_temp_log_options(&local_4c);
        if (data_type == LYD_TYPE_DATA_YANG) {
          pplVar6 = &local_80;
          if (local_a8 == (lyd_node **)0x0) {
            pplVar6 = (lyd_node **)0x0;
          }
          err = lyd_validate_all(&local_a0,(ly_ctx *)0x0,val_opts | 2,pplVar6);
        }
        else {
          pplVar6 = &local_80;
          if (local_a8 == (lyd_node **)0x0) {
            pplVar6 = (lyd_node **)0x0;
          }
          err = lyd_validate_op(plVar4,dep_tree,data_type,pplVar6);
        }
        ly_temp_log_options((uint32_t *)local_58);
        plVar4 = local_a0;
        if (local_98->count != 0) {
          uVar8 = 0;
          do {
            if ((local_98->field_2).dnodes[uVar8] == local_a0) {
              local_a0 = local_a0->next;
            }
            lyd_free_tree((local_98->field_2).dnodes[uVar8]);
            uVar8 = uVar8 + 1;
            plVar4 = local_a0;
          } while (uVar8 < local_98->count);
        }
        for (; plVar4 != (lyd_node *)0x0; plVar4 = plVar4->next) {
          *(byte *)&plVar4->flags = (byte)plVar4->flags | 8;
        }
        lyplg_ext_insert((lyd_node *)local_48,local_a0);
        pplVar6 = local_a8;
        if (err == LY_SUCCESS) {
          plVar4 = local_80;
          err = LY_SUCCESS;
          if (local_80 != (lyd_node *)0x0 && local_a8 != (lyd_node **)0x0) {
            do {
              *(byte *)&plVar4->flags = (byte)plVar4->flags | 8;
              plVar4 = plVar4->next;
            } while (plVar4 != (lyd_node *)0x0);
            if (local_a0 == (lyd_node *)0x0) {
              plVar7 = (lyd_node_inner *)0x0;
            }
            else {
              plVar7 = local_a0->parent;
            }
            err = lyd_dup_single((lyd_node *)plVar7,(lyd_node_inner *)0x0,6,(lyd_node **)&local_88);
            if ((err == LY_SUCCESS) &&
               (err = lyplg_ext_insert((lyd_node *)local_88,local_80), err == LY_SUCCESS)) {
              local_80 = (lyd_node *)0x0;
              while ((local_88 != (lyd_node_inner *)0x0 &&
                     (*(lyd_node_inner **)((long)&local_88->field_0 + 0x10) != (lyd_node_inner *)0x0
                     ))) {
                if (local_88 != (lyd_node_inner *)0x0) {
                  local_88 = *(lyd_node_inner **)((long)&local_88->field_0 + 0x10);
                }
                else {
                  local_88 = (lyd_node_inner *)0x0;
                }
              }
              plVar1 = (local_88->field_0).node.schema;
              if (plVar1 == (lysc_node *)0x0) {
                plVar5 = (lys_module *)&local_88[1].field_0.node.priv;
              }
              else {
                plVar5 = plVar1->module;
              }
              err = lyd_new_meta(plVar5->ctx,(lyd_node *)local_88,(lys_module *)0x0,"yang:operation"
                                 ,"none",0,(lyd_meta **)0x0);
              if (err == LY_SUCCESS) {
                err = lyd_diff_merge_all(pplVar6,(lyd_node *)local_88,1);
              }
            }
          }
        }
        else {
          if (local_a0->schema == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&local_a0[2].schema;
          }
          else {
            plVar5 = local_a0->schema->module;
          }
          eitem = ly_err_first(plVar5->ctx);
          if (eitem == (ly_err_item *)0x0) {
            lyplg_ext_compile_log
                      ((lysc_ctx *)0x0,ext,LY_LLERR,err,"Unknown validation error (err code %d).",
                       (ulong)err);
          }
          else {
            lyplg_ext_compile_log_err(eitem,ext);
          }
        }
      }
    }
  }
LAB_001a3a5e:
  ly_set_free(local_98,(_func_void_void_ptr *)0x0);
  lyd_free_siblings((lyd_node *)0x0);
  lyd_free_tree(local_80);
  lyd_free_all((lyd_node *)local_88);
  if (local_a9 != '\0') {
    lyd_free_all(local_70);
  }
  return err;
}

Assistant:

static LY_ERR
schema_mount_validate(struct lysc_ext_instance *ext, struct lyd_node *sibling, const struct lyd_node *dep_tree,
        enum lyd_type data_type, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE_LAST, i;
    const struct ly_err_item *err;
    struct lyd_node *iter, *ext_data = NULL, *ref_first = NULL, *orig_parent = lyd_parent(sibling), *op_tree;
    struct lyd_node *ext_diff = NULL, *diff_parent = NULL;
    ly_bool ext_data_free = 0;
    struct ly_set *ref_set = NULL;

    if (!sibling) {
        /* some data had to be parsed for this callback to be called */
        EXT_LOGERR_INT_RET(NULL, ext);
    }

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((ret = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        goto cleanup;
    }

    LY_LIST_FOR(ext_data, iter) {
        if (iter->flags & LYD_NEW) {
            /* must be validated for the parent-reference prefix data to be stored */
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, LY_EINVAL, "Provided ext data have not been validated.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* duplicate the referenced parent nodes into ext context */
    if ((ret = schema_mount_dup_parent_ref(ext, orig_parent, ext_data, LYD_CTX(sibling), &ref_set))) {
        goto cleanup;
    }

    if (data_type != LYD_TYPE_DATA_YANG) {
        /* remember the operation data tree, it may be moved */
        op_tree = sibling;
    }

    /* create accessible tree, remove LYD_EXT to not call this callback recursively */
    LY_CHECK_GOTO(lyd_unlink_siblings(sibling), cleanup);
    LY_LIST_FOR(sibling, iter) {
        iter->flags &= ~LYD_EXT;
    }
    if (ref_set->count) {
        if ((ret = lyd_insert_sibling(sibling, ref_set->dnodes[0], &sibling))) {
            goto cleanup;
        }
    }

    /* only store messages in the context, log as an extension */
    prev_lo = ly_temp_log_options(&temp_lo);

    if (data_type == LYD_TYPE_DATA_YANG) {
        /* validate all the modules with data */
        ret = lyd_validate_all(&sibling, NULL, val_opts | LYD_VALIDATE_PRESENT, diff ? &ext_diff : NULL);
    } else {
        /* validate the operation */
        ret = lyd_validate_op(op_tree, dep_tree, data_type, diff ? &ext_diff : NULL);
    }

    /* restore logging */
    ly_temp_log_options(prev_lo);

    /* restore sibling tree */
    for (i = 0; i < ref_set->count; ++i) {
        if (ref_set->dnodes[i] == sibling) {
            sibling = sibling->next;
        }
        lyd_free_tree(ref_set->dnodes[i]);
    }
    LY_LIST_FOR(sibling, iter) {
        iter->flags |= LYD_EXT;
    }
    lyplg_ext_insert(orig_parent, sibling);

    if (ret) {
        /* log the error in the original context */
        err = ly_err_first(LYD_CTX(sibling));
        if (!err) {
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, ret, "Unknown validation error (err code %d).", ret);
        } else {
            lyplg_ext_compile_log_err(err, ext);
        }
        goto cleanup;
    }

    /* create proper diff */
    if (diff && ext_diff) {
        /* diff nodes from an extension instance */
        LY_LIST_FOR(ext_diff, iter) {
            iter->flags |= LYD_EXT;
        }

        /* create the parent and insert the diff */
        if ((ret = lyd_dup_single(lyd_parent(sibling), NULL, LYD_DUP_WITH_PARENTS | LYD_DUP_NO_META, &diff_parent))) {
            goto cleanup;
        }
        if ((ret = lyplg_ext_insert(diff_parent, ext_diff))) {
            goto cleanup;
        }
        ext_diff = NULL;

        /* go top-level and set the operation */
        while (lyd_parent(diff_parent)) {
            diff_parent = lyd_parent(diff_parent);
        }
        if ((ret = lyd_new_meta(LYD_CTX(diff_parent), diff_parent, NULL, "yang:operation", "none", 0, NULL))) {
            goto cleanup;
        }

        /* finally merge into the global diff */
        if ((ret = lyd_diff_merge_all(diff, diff_parent, LYD_DIFF_MERGE_DEFAULTS))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(ref_set, NULL);
    lyd_free_siblings(ref_first);
    lyd_free_tree(ext_diff);
    lyd_free_all(diff_parent);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    return ret;
}